

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)

{
  ImGuiItemStatusFlags *pIVar1;
  ImRect *r_abs;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiID id;
  long lVar6;
  ImGuiContext *g;
  ImGuiWindow *this;
  uint uVar7;
  
  pIVar4 = GImGui;
  if ((flags & 0x10U) == 0) {
    this = GImGui->CurrentWindow;
    id = (this->DC).LastItemId;
    if (id == 0) {
      if ((GImGui->IO).MouseDown[0] != false) {
        if ((flags & 8U) == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.cpp"
                        ,0x22ab,"bool ImGui::BeginDragDropSource(ImGuiDragDropFlags)");
        }
        if ((((this->DC).LastItemStatusFlags & 1) != 0) ||
           ((GImGui->ActiveId != 0 && (GImGui->ActiveIdWindow == this)))) {
          r_abs = &(this->DC).LastItemRect;
          id = ImGuiWindow::GetIDFromRectangle(this,r_abs);
          (this->DC).LastItemId = id;
          bVar5 = ItemHoverable(r_abs,id);
          if ((bVar5) && ((pIVar4->IO).MouseClicked[0] == true)) {
            SetActiveID(id,this);
            FocusWindow(this);
          }
          if (pIVar4->ActiveId == id) goto LAB_002d4f1e;
        }
      }
    }
    else if (GImGui->ActiveId == id) {
      bVar5 = false;
      if ((GImGui->IO).MouseDown[0] == false) {
        return false;
      }
LAB_002d4f1e:
      pIVar4->ActiveIdAllowOverlap = bVar5;
      lVar6 = (long)(this->IDStack).Size;
      if (lVar6 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.h"
                      ,0x4e8,"T &ImVector<unsigned int>::back() [T = unsigned int]");
      }
      if (((GImGui->IO).MouseDown[0] != false) &&
         (fVar2 = (GImGui->IO).MouseDragThreshold,
         fVar2 * fVar2 <= (GImGui->IO).MouseDragMaxDistanceSqr[0])) {
        uVar7 = (this->IDStack).Data[lVar6 + -1];
        goto LAB_002d4ddc;
      }
    }
    bVar5 = false;
  }
  else {
    this = (ImGuiWindow *)0x0;
    id = ImHashStr("#SourceExtern",0,0);
    uVar7 = 0;
LAB_002d4ddc:
    if (pIVar4->DragDropActive == false) {
      if (id == 0) {
        __assert_fail("source_id != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.cpp"
                      ,0x22d5,"bool ImGui::BeginDragDropSource(ImGuiDragDropFlags)");
      }
      ClearDragDrop();
      (pIVar4->DragDropPayload).SourceId = id;
      (pIVar4->DragDropPayload).SourceParentId = uVar7;
      pIVar4->DragDropActive = true;
      pIVar4->DragDropSourceFlags = flags;
      pIVar4->DragDropMouseButton = 0;
    }
    pIVar4->DragDropSourceFrameCount = pIVar4->FrameCount;
    pIVar4->DragDropWithinSourceOrTarget = true;
    if ((((flags & 1U) == 0) && (BeginTooltip(), pIVar4->DragDropAcceptIdPrev != 0)) &&
       ((pIVar4->DragDropAcceptFlags & 0x1000) != 0)) {
      pIVar3 = pIVar4->CurrentWindow;
      pIVar3->SkipItems = true;
      pIVar3->HiddenFramesCanSkipItems = 1;
    }
    bVar5 = true;
    if ((flags & 0x12U) == 0) {
      pIVar1 = &(this->DC).LastItemStatusFlags;
      *(byte *)pIVar1 = (byte)*pIVar1 & 0xfe;
    }
  }
  return bVar5;
}

Assistant:

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    bool source_drag_active = false;
    ImGuiID source_id = 0;
    ImGuiID source_parent_id = 0;
    int mouse_button = 0;
    if (!(flags & ImGuiDragDropFlags_SourceExtern))
    {
        source_id = window->DC.LastItemId;
        if (source_id != 0 && g.ActiveId != source_id) // Early out for most common case
            return false;
        if (g.IO.MouseDown[mouse_button] == false)
            return false;

        if (source_id == 0)
        {
            // If you want to use BeginDragDropSource() on an item with no unique identifier for interaction, such as Text() or Image(), you need to:
            // A) Read the explanation below, B) Use the ImGuiDragDropFlags_SourceAllowNullID flag, C) Swallow your programmer pride.
            if (!(flags & ImGuiDragDropFlags_SourceAllowNullID))
            {
                IM_ASSERT(0);
                return false;
            }

            // Early out
            if ((window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HoveredRect) == 0 && (g.ActiveId == 0 || g.ActiveIdWindow != window))
                return false;

            // Magic fallback (=somehow reprehensible) to handle items with no assigned ID, e.g. Text(), Image()
            // We build a throwaway ID based on current ID stack + relative AABB of items in window.
            // THE IDENTIFIER WON'T SURVIVE ANY REPOSITIONING OF THE WIDGET, so if your widget moves your dragging operation will be canceled.
            // We don't need to maintain/call ClearActiveID() as releasing the button will early out this function and trigger !ActiveIdIsAlive.
            source_id = window->DC.LastItemId = window->GetIDFromRectangle(window->DC.LastItemRect);
            bool is_hovered = ItemHoverable(window->DC.LastItemRect, source_id);
            if (is_hovered && g.IO.MouseClicked[mouse_button])
            {
                SetActiveID(source_id, window);
                FocusWindow(window);
            }
            if (g.ActiveId == source_id) // Allow the underlying widget to display/return hovered during the mouse release frame, else we would get a flicker.
                g.ActiveIdAllowOverlap = is_hovered;
        }
        else
        {
            g.ActiveIdAllowOverlap = false;
        }
        if (g.ActiveId != source_id)
            return false;
        source_parent_id = window->IDStack.back();
        source_drag_active = IsMouseDragging(mouse_button);
    }
    else
    {
        window = NULL;
        source_id = ImHashStr("#SourceExtern");
        source_drag_active = true;
    }

    if (source_drag_active)
    {
        if (!g.DragDropActive)
        {
            IM_ASSERT(source_id != 0);
            ClearDragDrop();
            ImGuiPayload& payload = g.DragDropPayload;
            payload.SourceId = source_id;
            payload.SourceParentId = source_parent_id;
            g.DragDropActive = true;
            g.DragDropSourceFlags = flags;
            g.DragDropMouseButton = mouse_button;
        }
        g.DragDropSourceFrameCount = g.FrameCount;
        g.DragDropWithinSourceOrTarget = true;

        if (!(flags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
        {
            // Target can request the Source to not display its tooltip (we use a dedicated flag to make this request explicit)
            // We unfortunately can't just modify the source flags and skip the call to BeginTooltip, as caller may be emitting contents.
            BeginTooltip();
            if (g.DragDropAcceptIdPrev && (g.DragDropAcceptFlags & ImGuiDragDropFlags_AcceptNoPreviewTooltip))
            {
                ImGuiWindow* tooltip_window = g.CurrentWindow;
                tooltip_window->SkipItems = true;
                tooltip_window->HiddenFramesCanSkipItems = 1;
            }
        }

        if (!(flags & ImGuiDragDropFlags_SourceNoDisableHover) && !(flags & ImGuiDragDropFlags_SourceExtern))
            window->DC.LastItemStatusFlags &= ~ImGuiItemStatusFlags_HoveredRect;

        return true;
    }
    return false;
}